

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BufferStream.hh
# Opt level: O3

void __thiscall avro::ostream::~ostream(ostream *this)

{
  _func_int *p_Var1;
  _func_int *p_Var2;
  
  p_Var2 = (this->super_ostream)._vptr_basic_ostream[-3];
  p_Var1 = (_func_int *)((long)&(this->super_ostream)._vptr_basic_ostream + (long)p_Var2);
  *(undefined8 *)p_Var1 = 0x1d8db8;
  *(undefined8 *)(p_Var1 + 0x58) = 0x1d8de0;
  *(undefined ***)(p_Var1 + 8) = &PTR__ostreambuf_001d8e68;
  boost::detail::shared_count::~shared_count
            ((shared_count *)(&(this->super_ostream).field_0x50 + (long)p_Var2));
  *(code **)(&(this->super_ostream).field_0x8 + (long)p_Var2) = sysconf;
  std::locale::~locale((locale *)(&(this->super_ostream).field_0x40 + (long)p_Var2));
  std::ios_base::~ios_base((ios_base *)(p_Var1 + 0x58));
  operator_delete((_func_int *)((long)&(this->super_ostream)._vptr_basic_ostream + (long)p_Var2),
                  0x160);
  return;
}

Assistant:

class AVRO_DECL ostream : public std::ostream {

  public:

    /// Default constructor, creates a new OutputBuffer.
    ostream() : 
        std::ostream(&obuf_) 
    { }

    /// Output to a specific buffer.
    ostream(OutputBuffer &buf) : 
        std::ostream(&obuf_),
        obuf_(buf)
    { }

    /// Return the output buffer created by the write operations to this ostream.
    const OutputBuffer &getBuffer() const {
        return obuf_.getBuffer();
    }

  protected:

    ostreambuf obuf_;
}